

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O1

void __thiscall
MT32Emu::LA32WaveGenerator::computePositions
          (LA32WaveGenerator *this,Bit32u highLinearLength,Bit32u lowLinearLength,
          Bit32u resonanceWaveLengthFactor)

{
  anon_enum_32 aVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = (resonanceWaveLengthFactor >> 4) * (this->wavePosition >> 8);
  this->resonanceSinePosition = uVar2;
  this->squareWavePosition = uVar2;
  aVar1 = POSITIVE_RISING_SINE_SEGMENT;
  if (0x3ffff < uVar2) {
    uVar2 = uVar2 - 0x40000;
    this->squareWavePosition = uVar2;
    aVar1 = POSITIVE_LINEAR_SEGMENT;
    uVar3 = uVar2 - highLinearLength;
    if (highLinearLength <= uVar2) {
      this->squareWavePosition = uVar3;
      aVar1 = POSITIVE_FALLING_SINE_SEGMENT;
      if (0x3ffff < uVar3) {
        uVar2 = uVar3 - 0x40000;
        this->squareWavePosition = uVar2;
        this->resonanceSinePosition = uVar2;
        aVar1 = NEGATIVE_FALLING_SINE_SEGMENT;
        if (0x3ffff < uVar2) {
          uVar3 = uVar3 - 0x80000;
          this->squareWavePosition = uVar3;
          aVar1 = NEGATIVE_LINEAR_SEGMENT;
          if (lowLinearLength <= uVar3) {
            this->squareWavePosition = uVar3 - lowLinearLength;
            aVar1 = NEGATIVE_RISING_SINE_SEGMENT;
          }
        }
      }
    }
  }
  this->phase = aVar1;
  return;
}

Assistant:

void LA32WaveGenerator::computePositions(Bit32u highLinearLength, Bit32u lowLinearLength, Bit32u resonanceWaveLengthFactor) {
	// Assuming 12-bit multiplication used here
	squareWavePosition = resonanceSinePosition = (wavePosition >> 8) * (resonanceWaveLengthFactor >> 4);
	if (squareWavePosition < SINE_SEGMENT_RELATIVE_LENGTH) {
		phase = POSITIVE_RISING_SINE_SEGMENT;
		return;
	}
	squareWavePosition -= SINE_SEGMENT_RELATIVE_LENGTH;
	if (squareWavePosition < highLinearLength) {
		phase = POSITIVE_LINEAR_SEGMENT;
		return;
	}
	squareWavePosition -= highLinearLength;
	if (squareWavePosition < SINE_SEGMENT_RELATIVE_LENGTH) {
		phase = POSITIVE_FALLING_SINE_SEGMENT;
		return;
	}
	squareWavePosition -= SINE_SEGMENT_RELATIVE_LENGTH;
	resonanceSinePosition = squareWavePosition;
	if (squareWavePosition < SINE_SEGMENT_RELATIVE_LENGTH) {
		phase = NEGATIVE_FALLING_SINE_SEGMENT;
		return;
	}
	squareWavePosition -= SINE_SEGMENT_RELATIVE_LENGTH;
	if (squareWavePosition < lowLinearLength) {
		phase = NEGATIVE_LINEAR_SEGMENT;
		return;
	}
	squareWavePosition -= lowLinearLength;
	phase = NEGATIVE_RISING_SINE_SEGMENT;
}